

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFindPackageCommand::FillPrefixesCMakeEnvironment(cmFindPackageCommand *this)

{
  pointer pcVar1;
  mapped_type *this_00;
  size_t startIndex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string debugBuffer;
  string local_a0;
  undefined1 local_80 [32];
  undefined8 local_60;
  char *local_58;
  string local_50;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeEnvironment);
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  cmSearchPath::AddEnvPath(this_00,&this->Variable);
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_80._24_8_ = (this->Variable)._M_dataplus._M_p;
    local_80._16_8_ = (this->Variable)._M_string_length;
    local_80._0_8_ = (pointer)0xd;
    local_80._8_8_ = "Env variable ";
    local_60 = 0x2a;
    local_58 = " [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n";
    views._M_len = 3;
    views._M_array = (iterator)local_80;
    cmCatViews_abi_cxx11_(&local_50,views);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    startIndex = anon_unknown.dwarf_86e7a3::collectPathsForDebug(&local_a0,this_00,0);
  }
  else {
    startIndex = 0;
  }
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"CMAKE_PREFIX_PATH","");
  cmSearchPath::AddEnvPath(this_00,(string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_80._0_8_ = local_a0._M_string_length;
    local_80._8_8_ = local_a0._M_dataplus._M_p;
    local_80._16_8_ = (pointer)0x48;
    local_80._24_8_ = "CMAKE_PREFIX_PATH env variable [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_80;
    cmCatViews_abi_cxx11_(&local_50,views_00);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    startIndex = anon_unknown.dwarf_86e7a3::collectPathsForDebug(&local_a0,this_00,startIndex);
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"CMAKE_FRAMEWORK_PATH","");
  cmSearchPath::AddEnvPath(this_00,(string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"CMAKE_APPBUNDLE_PATH","");
  cmSearchPath::AddEnvPath(this_00,(string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    local_80._0_8_ = local_a0._M_string_length;
    local_80._8_8_ = local_a0._M_dataplus._M_p;
    local_80._16_8_ = 0x65;
    local_80._24_8_ =
         "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH env variables [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n"
    ;
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_80;
    cmCatViews_abi_cxx11_(&local_50,views_01);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    anon_unknown.dwarf_86e7a3::collectPathsForDebug(&local_a0,this_00,startIndex);
    local_80._8_8_ = (this->DebugBuffer)._M_dataplus._M_p;
    local_80._0_8_ = (this->DebugBuffer)._M_string_length;
    local_80._16_8_ = local_a0._M_string_length;
    local_80._24_8_ = local_a0._M_dataplus._M_p;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_80;
    cmCatViews_abi_cxx11_(&local_50,views_02);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeEnvironment()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeEnvironment];
  std::string debugBuffer;
  std::size_t debugOffset = 0;

  // Check the environment variable with the same name as the cache
  // entry.
  paths.AddEnvPath(this->Variable);
  if (this->DebugMode) {
    debugBuffer = cmStrCat("Env variable ", this->Variable,
                           " [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    debugOffset = collectPathsForDebug(debugBuffer, paths);
  }

  // And now the general CMake environment variables
  paths.AddEnvPath("CMAKE_PREFIX_PATH");
  if (this->DebugMode) {
    debugBuffer = cmStrCat(debugBuffer,
                           "CMAKE_PREFIX_PATH env variable "
                           "[CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    debugOffset = collectPathsForDebug(debugBuffer, paths, debugOffset);
  }

  paths.AddEnvPath("CMAKE_FRAMEWORK_PATH");
  paths.AddEnvPath("CMAKE_APPBUNDLE_PATH");
  if (this->DebugMode) {
    debugBuffer =
      cmStrCat(debugBuffer,
               "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH env "
               "variables [CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH].\n");
    collectPathsForDebug(debugBuffer, paths, debugOffset);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}